

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipcm.c
# Opt level: O0

void multipcm_alloc_rom(void *info,UINT32 memsize)

{
  UINT32 UVar1;
  void *pvVar2;
  MultiPCM *ptChip;
  UINT32 memsize_local;
  void *info_local;
  
  if (*(UINT32 *)((long)info + 0x22cc) != memsize) {
    pvVar2 = realloc(*(void **)((long)info + 0x22d0),(ulong)memsize);
    *(void **)((long)info + 0x22d0) = pvVar2;
    *(UINT32 *)((long)info + 0x22cc) = memsize;
    memset(*(void **)((long)info + 0x22d0),0xff,(ulong)memsize);
    UVar1 = pow2_mask(memsize);
    *(UINT32 *)((long)info + 0x22c8) = UVar1;
  }
  return;
}

Assistant:

static void multipcm_alloc_rom(void* info, UINT32 memsize)
{
	MultiPCM *ptChip = (MultiPCM *)info;
	
	if (ptChip->ROMSize == memsize)
		return;
	
	ptChip->ROM = (UINT8*)realloc(ptChip->ROM, memsize);
	ptChip->ROMSize = memsize;
	memset(ptChip->ROM, 0xFF, memsize);
	
	ptChip->ROMMask = pow2_mask(memsize);
	
	return;
}